

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_pubkey_combine
              (secp256k1_context *ctx,secp256k1_pubkey_conflict *pubnonce,
              secp256k1_pubkey_conflict **pubnonces,size_t n)

{
  size_t sVar1;
  secp256k1_gej Qj;
  secp256k1_ge Q;
  secp256k1_ge_storage s;
  secp256k1_gej local_148;
  secp256k1_ge local_c8;
  secp256k1_ge_storage local_70;
  
  if (pubnonce == (secp256k1_pubkey_conflict *)0x0) {
    secp256k1_ec_pubkey_combine_cold_3();
  }
  else {
    pubnonce->data[0x30] = '\0';
    pubnonce->data[0x31] = '\0';
    pubnonce->data[0x32] = '\0';
    pubnonce->data[0x33] = '\0';
    pubnonce->data[0x34] = '\0';
    pubnonce->data[0x35] = '\0';
    pubnonce->data[0x36] = '\0';
    pubnonce->data[0x37] = '\0';
    pubnonce->data[0x38] = '\0';
    pubnonce->data[0x39] = '\0';
    pubnonce->data[0x3a] = '\0';
    pubnonce->data[0x3b] = '\0';
    pubnonce->data[0x3c] = '\0';
    pubnonce->data[0x3d] = '\0';
    pubnonce->data[0x3e] = '\0';
    pubnonce->data[0x3f] = '\0';
    pubnonce->data[0x20] = '\0';
    pubnonce->data[0x21] = '\0';
    pubnonce->data[0x22] = '\0';
    pubnonce->data[0x23] = '\0';
    pubnonce->data[0x24] = '\0';
    pubnonce->data[0x25] = '\0';
    pubnonce->data[0x26] = '\0';
    pubnonce->data[0x27] = '\0';
    pubnonce->data[0x28] = '\0';
    pubnonce->data[0x29] = '\0';
    pubnonce->data[0x2a] = '\0';
    pubnonce->data[0x2b] = '\0';
    pubnonce->data[0x2c] = '\0';
    pubnonce->data[0x2d] = '\0';
    pubnonce->data[0x2e] = '\0';
    pubnonce->data[0x2f] = '\0';
    pubnonce->data[0x10] = '\0';
    pubnonce->data[0x11] = '\0';
    pubnonce->data[0x12] = '\0';
    pubnonce->data[0x13] = '\0';
    pubnonce->data[0x14] = '\0';
    pubnonce->data[0x15] = '\0';
    pubnonce->data[0x16] = '\0';
    pubnonce->data[0x17] = '\0';
    pubnonce->data[0x18] = '\0';
    pubnonce->data[0x19] = '\0';
    pubnonce->data[0x1a] = '\0';
    pubnonce->data[0x1b] = '\0';
    pubnonce->data[0x1c] = '\0';
    pubnonce->data[0x1d] = '\0';
    pubnonce->data[0x1e] = '\0';
    pubnonce->data[0x1f] = '\0';
    pubnonce->data[0] = '\0';
    pubnonce->data[1] = '\0';
    pubnonce->data[2] = '\0';
    pubnonce->data[3] = '\0';
    pubnonce->data[4] = '\0';
    pubnonce->data[5] = '\0';
    pubnonce->data[6] = '\0';
    pubnonce->data[7] = '\0';
    pubnonce->data[8] = '\0';
    pubnonce->data[9] = '\0';
    pubnonce->data[10] = '\0';
    pubnonce->data[0xb] = '\0';
    pubnonce->data[0xc] = '\0';
    pubnonce->data[0xd] = '\0';
    pubnonce->data[0xe] = '\0';
    pubnonce->data[0xf] = '\0';
    if (n == 0) {
      secp256k1_ec_pubkey_combine_cold_2();
    }
    else {
      if (pubnonces != (secp256k1_pubkey_conflict **)0x0) {
        local_148.infinity = 1;
        local_148.x.n[0] = 0;
        local_148.x.n[1] = 0;
        local_148.x.n[2] = 0;
        local_148.x.n[3] = 0;
        local_148.x.n[4] = 0;
        local_148.y.n[0] = 0;
        local_148.y.n[1] = 0;
        local_148.y.n[2] = 0;
        local_148.y.n[3] = 0;
        local_148.y.n[4] = 0;
        local_148.z.n[0] = 0;
        local_148.z.n[1] = 0;
        local_148.z.n[2] = 0;
        local_148.z.n[3] = 0;
        local_148.z.n[4] = 0;
        sVar1 = 0;
        do {
          secp256k1_pubkey_load(ctx,&local_c8,pubnonces[sVar1]);
          secp256k1_gej_add_ge(&local_148,&local_148,&local_c8);
          sVar1 = sVar1 + 1;
        } while (n != sVar1);
        if (local_148.infinity != 0) {
          return 0;
        }
        secp256k1_ge_set_gej(&local_c8,&local_148);
        secp256k1_ge_to_storage(&local_70,&local_c8);
        *(uint64_t *)(pubnonce->data + 0x30) = local_70.y.n[2];
        *(uint64_t *)(pubnonce->data + 0x38) = local_70.y.n[3];
        *(uint64_t *)(pubnonce->data + 0x20) = local_70.y.n[0];
        *(uint64_t *)(pubnonce->data + 0x28) = local_70.y.n[1];
        *(uint64_t *)(pubnonce->data + 0x10) = local_70.x.n[2];
        *(uint64_t *)(pubnonce->data + 0x18) = local_70.x.n[3];
        *(uint64_t *)pubnonce->data = local_70.x.n[0];
        *(uint64_t *)(pubnonce->data + 8) = local_70.x.n[1];
        return 1;
      }
      secp256k1_ec_pubkey_combine_cold_1();
    }
  }
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_combine(const secp256k1_context* ctx, secp256k1_pubkey *pubnonce, const secp256k1_pubkey * const *pubnonces, size_t n) {
    size_t i;
    secp256k1_gej Qj;
    secp256k1_ge Q;

    ARG_CHECK(pubnonce != NULL);
    memset(pubnonce, 0, sizeof(*pubnonce));
    ARG_CHECK(n >= 1);
    ARG_CHECK(pubnonces != NULL);

    secp256k1_gej_set_infinity(&Qj);

    for (i = 0; i < n; i++) {
        secp256k1_pubkey_load(ctx, &Q, pubnonces[i]);
        secp256k1_gej_add_ge(&Qj, &Qj, &Q);
    }
    if (secp256k1_gej_is_infinity(&Qj)) {
        return 0;
    }
    secp256k1_ge_set_gej(&Q, &Qj);
    secp256k1_pubkey_save(pubnonce, &Q);
    return 1;
}